

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

SplitNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_splitnd(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3cf) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3cf;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x40);
    SplitNDLayerParams::SplitNDLayerParams(this_00.splitnd_);
    (this->layer_).splitnd_ = (SplitNDLayerParams *)this_00;
  }
  return (SplitNDLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SplitNDLayerParams* NeuralNetworkLayer::mutable_splitnd() {
  if (!has_splitnd()) {
    clear_layer();
    set_has_splitnd();
    layer_.splitnd_ = new ::CoreML::Specification::SplitNDLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.splitND)
  return layer_.splitnd_;
}